

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

void shar_quote(archive_string *buf,char *str,int in_shell)

{
  size_t n;
  size_t len;
  char *pcStack_18;
  int in_shell_local;
  char *str_local;
  archive_string *buf_local;
  
  pcStack_18 = str;
  while (*pcStack_18 != '\0') {
    n = strcspn(pcStack_18,"\n \t\'`\";&<>()|*?{}[]\\$!#^~");
    if (n == 0) {
      if (*pcStack_18 == '\n') {
        if (in_shell == 0) {
          archive_strcat(buf,"\\n");
        }
        else {
          archive_strcat(buf,"\"\n\"");
        }
      }
      else {
        archive_strappend_char(buf,'\\');
        archive_strappend_char(buf,*pcStack_18);
      }
      pcStack_18 = pcStack_18 + 1;
    }
    else {
      archive_strncat(buf,pcStack_18,n);
      pcStack_18 = pcStack_18 + n;
    }
  }
  return;
}

Assistant:

static void
shar_quote(struct archive_string *buf, const char *str, int in_shell)
{
	static const char meta[] = "\n \t'`\";&<>()|*?{}[]\\$!#^~";
	size_t len;

	while (*str != '\0') {
		if ((len = strcspn(str, meta)) != 0) {
			archive_strncat(buf, str, len);
			str += len;
		} else if (*str == '\n') {
			if (in_shell)
				archive_strcat(buf, "\"\n\"");
			else
				archive_strcat(buf, "\\n");
			++str;
		} else {
			archive_strappend_char(buf, '\\');
			archive_strappend_char(buf, *str);
			++str;
		}
	}
}